

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_c688bb::HandleRegexCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  undefined7 extraout_var;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  cmExecutionStatus *pcVar15;
  byte bVar16;
  char *pcVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string_view value;
  string_view value_00;
  string_view value_01;
  string output;
  string e_2;
  string input;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  cmExecutionStatus *local_1f0;
  undefined1 local_1e8 [36];
  undefined4 local_1c4;
  pointer local_1c0;
  string *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  cmStringReplaceHelper local_188;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) {
    local_188.ErrorString._M_dataplus._M_p = (pointer)&local_188.ErrorString.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"sub-command REGEX requires a mode to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    __rhs = pbVar14 + 1;
    iVar10 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar10 == 0) {
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (0x80 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
        cmMakefile::ClearMatches(status->Makefile);
        local_188.RegularExpression.regmatch.endp[4] = (char *)0x0;
        local_188.RegularExpression.regmatch.endp[6] = (char *)0x0;
        local_188.RegularExpression.regmatch.endp[7]._0_4_ = 0;
        memset(&local_188,0,0xaa);
        bVar9 = cmsys::RegularExpression::compile
                          ((RegularExpression *)&local_188,pbVar14[2]._M_dataplus._M_p);
        if (!bVar9) {
          std::operator+(&local_250,"sub-command REGEX, mode MATCH failed to compile regex \"",
                         pbVar14 + 2);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_250);
          local_210._M_allocated_capacity = (size_type)&local_200;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar12) {
            local_200._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_200._8_8_ = plVar11[3];
          }
          else {
            local_200._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_210._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_210._8_8_ = plVar11[1];
          *plVar11 = (long)paVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002c697a;
        }
        local_230._8_8_ =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_230._M_allocated_capacity =
             (size_type)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 4);
        paVar12 = &local_250.field_2;
        local_250._M_string_length = 0;
        local_250.field_2._M_allocated_capacity =
             local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = paVar12;
        local_250._M_dataplus._M_p = (pointer)paVar12;
        cmJoin((string *)&local_210,(cmStringRange *)&local_230,(string_view)(auVar2 << 0x40),
               (string_view)ZEXT816(0));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar12) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        local_250._M_string_length = 0;
        local_250.field_2._M_allocated_capacity =
             local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_250._M_dataplus._M_p = (pointer)paVar12;
        bVar9 = cmsys::RegularExpression::find
                          ((RegularExpression *)&local_188,(char *)local_210._M_allocated_capacity,
                           (RegularExpressionMatch *)&local_188);
        if (bVar9) {
          cmMakefile::StoreMatches(status->Makefile,(RegularExpression *)&local_188);
          if (local_188.RegularExpression.regmatch.startp[2] ==
              local_188.ErrorString._M_dataplus._M_p) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e8,"sub-command REGEX, mode MATCH regex \"",pbVar14 + 2);
            plVar11 = (long *)std::__cxx11::string::append(local_1e8);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar13) {
              local_220._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_220._8_8_ = plVar11[3];
              local_230._M_allocated_capacity = (size_type)&local_220;
            }
            else {
              local_220._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_230._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar11;
            }
            local_230._8_8_ = plVar11[1];
            *plVar11 = (long)paVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
            }
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_allocated_capacity != &local_220) goto LAB_002c6318;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_210);
            std::__cxx11::string::operator=((string *)&local_250,(string *)local_230._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_allocated_capacity != &local_220) {
LAB_002c6318:
              operator_delete((void *)local_230._M_allocated_capacity,
                              local_220._M_allocated_capacity + 1);
            }
          }
          if (local_188.RegularExpression.regmatch.startp[2] !=
              local_188.ErrorString._M_dataplus._M_p) goto LAB_002c632e;
          bVar16 = 0;
        }
        else {
LAB_002c632e:
          bVar16 = 1;
          value._M_str = local_250._M_dataplus._M_p;
          value._M_len = local_250._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,pbVar14 + 3,value);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar12) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_allocated_capacity != &local_200) {
          operator_delete((void *)local_210._M_allocated_capacity,
                          local_200._M_allocated_capacity + 1);
        }
LAB_002c6993:
        if (local_188.RegularExpression.regmatch.endp[6] != (char *)0x0) {
          operator_delete__(local_188.RegularExpression.regmatch.endp[6]);
        }
        return (bool)bVar16;
      }
      local_188.ErrorString._M_dataplus._M_p = (pointer)&local_188.ErrorString.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,
                 "sub-command REGEX, mode MATCH needs at least 5 arguments total to command.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar10 == 0) {
        pbVar14 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_1f0 = status;
        if (0x80 < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
          cmMakefile::ClearMatches(status->Makefile);
          local_188.RegularExpression.regmatch.endp[4] = (char *)0x0;
          local_188.RegularExpression.regmatch.endp[6] = (char *)0x0;
          local_188.RegularExpression.regmatch.endp[7]._0_4_ = 0;
          memset(&local_188,0,0xaa);
          bVar9 = cmsys::RegularExpression::compile
                            ((RegularExpression *)&local_188,pbVar14[2]._M_dataplus._M_p);
          local_1c0 = pbVar14;
          if (bVar9) {
            local_230._8_8_ =
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_230._M_allocated_capacity =
                 (size_type)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 4);
            paVar12 = &local_250.field_2;
            local_250._M_string_length = 0;
            local_250.field_2._M_allocated_capacity =
                 local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = paVar12;
            local_250._M_dataplus._M_p = (pointer)paVar12;
            cmJoin((string *)&local_210,(cmStringRange *)&local_230,(string_view)(auVar3 << 0x40),
                   (string_view)ZEXT816(0));
            pcVar15 = local_1f0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != paVar12) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            local_1c0 = local_1c0 + 3;
            local_250._M_string_length = 0;
            local_250.field_2._M_allocated_capacity =
                 local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1b8 = (string *)&pcVar15->Error;
            uVar19 = local_210._M_allocated_capacity;
            local_250._M_dataplus._M_p = (pointer)paVar12;
            local_1b0 = pbVar14 + 2;
            do {
              bVar9 = cmsys::RegularExpression::find
                                ((RegularExpression *)&local_188,(char *)uVar19,
                                 (RegularExpressionMatch *)&local_188);
              local_1c4 = (undefined4)CONCAT71(extraout_var,bVar9);
              if (!bVar9) {
                value_01._M_str = local_250._M_dataplus._M_p;
                value_01._M_len = local_250._M_string_length;
                cmMakefile::AddDefinition(pcVar15->Makefile,local_1c0,value_01);
                break;
              }
              cmMakefile::ClearMatches(pcVar15->Makefile);
              cmMakefile::StoreMatches(pcVar15->Makefile,(RegularExpression *)&local_188);
              pcVar8 = local_188.RegularExpression.regmatch.endp[2];
              pcVar7 = local_188.RegularExpression.regmatch.startp[2];
              _Var6._M_p = local_188.ErrorString._M_dataplus._M_p;
              if (local_188.RegularExpression.regmatch.startp[2] ==
                  local_188.ErrorString._M_dataplus._M_p) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1e8,"sub-command REGEX, mode MATCHALL regex \"",local_1b0);
                plVar11 = (long *)std::__cxx11::string::append((char *)local_1e8);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 == paVar12) {
                  local_220._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_220._8_8_ = plVar11[3];
                  local_230._M_allocated_capacity = (size_type)&local_220;
                }
                else {
                  local_220._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_230._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar11;
                }
                local_230._8_8_ = plVar11[1];
                *plVar11 = (long)paVar12;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
                  operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                }
                std::__cxx11::string::_M_assign(local_1b8);
              }
              else {
                if (local_250._M_string_length != 0) {
                  std::__cxx11::string::append((char *)&local_250);
                }
                pcVar17 = (char *)(uVar19 + ((long)_Var6._M_p - (long)pcVar8));
                uVar19 = uVar19 + ((long)pcVar7 - (long)pcVar8);
                local_230._M_allocated_capacity = (size_type)&local_220;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,pcVar17,uVar19)
                ;
                std::__cxx11::string::_M_append((char *)&local_250,local_230._M_allocated_capacity);
                pcVar15 = local_1f0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_allocated_capacity != &local_220) {
                operator_delete((void *)local_230._M_allocated_capacity,
                                local_220._M_allocated_capacity + 1);
              }
            } while (pcVar7 != _Var6._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            uVar5 = local_1c4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_allocated_capacity != &local_200) {
              operator_delete((void *)local_210._M_allocated_capacity,
                              local_200._M_allocated_capacity + 1);
            }
            bVar16 = (byte)uVar5 ^ 1;
            goto LAB_002c6993;
          }
          std::operator+(&local_250,"sub-command REGEX, mode MATCHALL failed to compile regex \"",
                         pbVar14 + 2);
          pcVar15 = local_1f0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_250);
          local_210._M_allocated_capacity = (size_type)&local_200;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar12) {
            local_200._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_200._8_8_ = plVar11[3];
          }
          else {
            local_200._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_210._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_210._8_8_ = plVar11[1];
          *plVar11 = (long)paVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_assign((string *)&pcVar15->Error);
LAB_002c697a:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_allocated_capacity != &local_200) {
            operator_delete((void *)local_210._M_allocated_capacity,
                            local_200._M_allocated_capacity + 1);
          }
          bVar16 = 0;
          goto LAB_002c6993;
        }
        local_188.ErrorString._M_dataplus._M_p = (pointer)&local_188.ErrorString.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,
                   "sub-command REGEX, mode MATCHALL needs at least 5 arguments total to command.",
                   "");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar10 != 0) {
          std::operator+(&local_188.ErrorString,"sub-command REGEX does not recognize mode ",__rhs);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.ErrorString._M_dataplus._M_p == &local_188.ErrorString.field_2) {
            return (bool)0;
          }
          goto LAB_002c6075;
        }
        pbVar14 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (0xbf < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
          pcVar1 = pbVar14[3]._M_dataplus._M_p;
          local_210._M_allocated_capacity = (size_type)&local_200;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_210,pcVar1,pcVar1 + pbVar14[3]._M_string_length);
          cmStringReplaceHelper::cmStringReplaceHelper
                    (&local_188,pbVar14 + 2,(string *)&local_210,status->Makefile);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_allocated_capacity != &local_200) {
            operator_delete((void *)local_210._M_allocated_capacity,
                            local_200._M_allocated_capacity + 1);
          }
          if (local_188.ValidReplaceExpression == false) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_230,"sub-command REGEX, mode REPLACE: ",&local_188.ErrorString);
            plVar11 = (long *)std::__cxx11::string::append(local_230._M_local_buf);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar12) {
              local_250.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_250.field_2._8_8_ = plVar11[3];
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            }
            else {
              local_250.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_250._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_250._M_string_length = plVar11[1];
            *plVar11 = (long)paVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            uVar19 = local_220._M_allocated_capacity;
            uVar18 = local_230._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_allocated_capacity != &local_220) {
LAB_002c6bde:
              operator_delete((void *)uVar18,uVar19 + 1);
            }
          }
          else {
            cmMakefile::ClearMatches(status->Makefile);
            if (local_188.RegularExpression.program != (char *)0x0) {
              local_1e8._0_8_ =
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5;
              local_1e8._8_8_ =
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              local_230._8_8_ = 0;
              local_220._M_allocated_capacity = local_220._M_allocated_capacity & 0xffffffffffffff00
              ;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = &local_220;
              local_230._M_allocated_capacity = (size_type)&local_220;
              cmJoin(&local_250,(cmStringRange *)local_1e8,(string_view)(auVar4 << 0x40),
                     (string_view)ZEXT816(0));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_allocated_capacity != &local_220) {
                operator_delete((void *)local_230._M_allocated_capacity,
                                local_220._M_allocated_capacity + 1);
              }
              local_230._8_8_ = (pointer)0x0;
              local_220._M_allocated_capacity = local_220._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_230._M_allocated_capacity = (size_type)&local_220;
              bVar9 = cmStringReplaceHelper::Replace(&local_188,&local_250,(string *)&local_230);
              if (bVar9) {
                value_00._M_str = (char *)local_230._M_allocated_capacity;
                value_00._M_len = local_230._8_8_;
                cmMakefile::AddDefinition(status->Makefile,pbVar14 + 4,value_00);
              }
              else {
                std::operator+(&local_1a8,"sub-command REGEX, mode REPLACE: ",&local_188.ErrorString
                              );
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
                pbVar14 = (pointer)(plVar11 + 2);
                if ((pointer)*plVar11 == pbVar14) {
                  local_1e8._16_8_ = (pbVar14->_M_dataplus)._M_p;
                  local_1e8._24_8_ = plVar11[3];
                  local_1e8._0_8_ = (pointer)(local_1e8 + 0x10);
                }
                else {
                  local_1e8._16_8_ = (pbVar14->_M_dataplus)._M_p;
                  local_1e8._0_8_ = (pointer)*plVar11;
                }
                local_1e8._8_8_ = plVar11[1];
                *plVar11 = (long)pbVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::_M_assign((string *)&status->Error);
                if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
                  operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_allocated_capacity != &local_220) {
                operator_delete((void *)local_230._M_allocated_capacity,
                                local_220._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              goto LAB_002c6c89;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_230,"sub-command REGEX, mode REPLACE failed to compile regex \"",
                           pbVar14 + 2);
            plVar11 = (long *)std::__cxx11::string::append(local_230._M_local_buf);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar12) {
              local_250.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_250.field_2._8_8_ = plVar11[3];
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            }
            else {
              local_250.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_250._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_250._M_string_length = plVar11[1];
            *plVar11 = (long)paVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_allocated_capacity != &local_220) {
              operator_delete((void *)local_230._M_allocated_capacity,
                              local_220._M_allocated_capacity + 1);
            }
            std::__cxx11::string::_M_assign((string *)&status->Error);
            uVar19 = local_250.field_2._M_allocated_capacity;
            uVar18 = local_250._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) goto LAB_002c6bde;
          }
          bVar9 = false;
LAB_002c6c89:
          std::
          vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
          ::~vector(&local_188.Replacements);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.ReplaceExpression._M_dataplus._M_p !=
              &local_188.ReplaceExpression.field_2) {
            operator_delete(local_188.ReplaceExpression._M_dataplus._M_p,
                            local_188.ReplaceExpression.field_2._M_allocated_capacity + 1);
          }
          if (local_188.RegularExpression.program != (char *)0x0) {
            operator_delete__(local_188.RegularExpression.program);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.RegExString._M_dataplus._M_p != &local_188.RegExString.field_2) {
            operator_delete(local_188.RegExString._M_dataplus._M_p,
                            local_188.RegExString.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.ErrorString._M_dataplus._M_p != &local_188.ErrorString.field_2) {
            operator_delete(local_188.ErrorString._M_dataplus._M_p,
                            local_188.ErrorString.field_2._M_allocated_capacity + 1);
            return bVar9;
          }
          return bVar9;
        }
        local_188.ErrorString._M_dataplus._M_p = (pointer)&local_188.ErrorString.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,
                   "sub-command REGEX, mode REPLACE needs at least 6 arguments total to command.",""
                  );
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.ErrorString._M_dataplus._M_p == &local_188.ErrorString.field_2) {
    return (bool)0;
  }
LAB_002c6075:
  operator_delete(local_188.ErrorString._M_dataplus._M_p,
                  local_188.ErrorString.field_2._M_allocated_capacity + 1);
  return (bool)0;
}

Assistant:

bool HandleRegexCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command REGEX requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if (mode == "MATCH") {
    if (args.size() < 5) {
      status.SetError("sub-command REGEX, mode MATCH needs "
                      "at least 5 arguments total to command.");
      return false;
    }
    return RegexMatch(args, status);
  }
  if (mode == "MATCHALL") {
    if (args.size() < 5) {
      status.SetError("sub-command REGEX, mode MATCHALL needs "
                      "at least 5 arguments total to command.");
      return false;
    }
    return RegexMatchAll(args, status);
  }
  if (mode == "REPLACE") {
    if (args.size() < 6) {
      status.SetError("sub-command REGEX, mode REPLACE needs "
                      "at least 6 arguments total to command.");
      return false;
    }
    return RegexReplace(args, status);
  }

  std::string e = "sub-command REGEX does not recognize mode " + mode;
  status.SetError(e);
  return false;
}